

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.cpp
# Opt level: O3

FILE * fsbridge::fopen(char *__filename,char *__modes)

{
  FILE *pFVar1;
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    pFVar1 = ::fopen(*(char **)__filename,__modes);
    return pFVar1;
  }
  __stack_chk_fail();
}

Assistant:

FILE *fopen(const fs::path& p, const char *mode)
{
#ifndef WIN32
    return ::fopen(p.c_str(), mode);
#else
    std::wstring_convert<std::codecvt_utf8_utf16<wchar_t>,wchar_t> utf8_cvt;
    return ::_wfopen(p.wstring().c_str(), utf8_cvt.from_bytes(mode).c_str());
#endif
}